

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyLogger.cpp
# Opt level: O0

void __thiscall liblogger::ProxyLogger::LogError(ProxyLogger *this,char *fmt,...)

{
  undefined8 uVar1;
  undefined8 uVar2;
  allocator<char> *in_RCX;
  char *in_RSI;
  undefined8 in_RDI;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string str;
  int res;
  va_list ap;
  char *tmp;
  allocator<char> local_61;
  string local_60 [36];
  int local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  char *local_18;
  char *local_10;
  undefined8 local_8;
  
  local_18 = (char *)0x0;
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_3c = vasprintf(&local_18,in_RSI,&local_38);
  if (local_3c < 0) {
    abort();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_R9,in_R8,in_RCX);
  std::allocator<char>::~allocator(&local_61);
  uVar1 = std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::c_str();
  liblogger::Logger(LOGGER_ERR,"%s %s ",uVar1,uVar2);
  free(local_18);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void ProxyLogger::LogError(const char *fmt, ...) {
	char *tmp = 0;

	va_list ap;
	va_start(ap, fmt);
	int res = vasprintf(&tmp, fmt, ap);
	if (res < 0)
		abort();
	std::string str = tmp;
	liblogger::Logger(LOGGER_ERR, "%s %s ", m_prefix.c_str(), str.c_str());
	free(tmp);
	va_end(ap);
}